

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O2

ze_result_t
loader::zetMetricQueryCreate
          (zet_metric_query_pool_handle_t hMetricQueryPool,uint32_t index,
          zet_metric_query_handle_t *phMetricQuery)

{
  zet_pfnMetricQueryCreate_t p_Var1;
  ze_result_t zVar2;
  object_t<_zet_metric_query_handle_t_*> *poVar3;
  dditable_t *dditable;
  dditable_t *local_10;
  
  local_10 = *(dditable_t **)(hMetricQueryPool + 8);
  p_Var1 = (local_10->zet).MetricQuery.pfnCreate;
  if (p_Var1 == (zet_pfnMetricQueryCreate_t)0x0) {
    zVar2 = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    zVar2 = (*p_Var1)(*(zet_metric_query_pool_handle_t *)hMetricQueryPool,index,phMetricQuery);
    if (zVar2 == ZE_RESULT_SUCCESS) {
      poVar3 = singleton_factory_t<object_t<_zet_metric_query_handle_t*>,_zet_metric_query_handle_t*>
               ::getInstance<_zet_metric_query_handle_t*&,dditable_t*&>
                         ((singleton_factory_t<object_t<_zet_metric_query_handle_t*>,_zet_metric_query_handle_t*>
                           *)(context + 0x12c0),phMetricQuery,&local_10);
      *phMetricQuery = (zet_metric_query_handle_t)poVar3;
      zVar2 = ZE_RESULT_SUCCESS;
    }
  }
  return zVar2;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricQueryCreate(
        zet_metric_query_pool_handle_t hMetricQueryPool,///< [in] handle of the metric query pool
        uint32_t index,                                 ///< [in] index of the query within the pool
        zet_metric_query_handle_t* phMetricQuery        ///< [out] handle of metric query
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_metric_query_pool_object_t*>( hMetricQueryPool )->dditable;
        auto pfnCreate = dditable->zet.MetricQuery.pfnCreate;
        if( nullptr == pfnCreate )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hMetricQueryPool = reinterpret_cast<zet_metric_query_pool_object_t*>( hMetricQueryPool )->handle;

        // forward to device-driver
        result = pfnCreate( hMetricQueryPool, index, phMetricQuery );

        if( ZE_RESULT_SUCCESS != result )
            return result;

        try
        {
            // convert driver handle to loader handle
            *phMetricQuery = reinterpret_cast<zet_metric_query_handle_t>(
                context->zet_metric_query_factory.getInstance( *phMetricQuery, dditable ) );
        }
        catch( std::bad_alloc& )
        {
            result = ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY;
        }

        return result;
    }